

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestHG.cxx
# Opt level: O0

string * __thiscall
cmCTestHG::GetWorkingRevision_abi_cxx11_(string *__return_storage_ptr__,cmCTestHG *this)

{
  pointer *this_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_408;
  string local_3b8;
  undefined1 local_398 [8];
  OutputLogger err;
  IdentifyParser out;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_d8;
  undefined1 local_d7;
  allocator<char> local_d6;
  allocator<char> local_d5 [13];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  string local_a0 [32];
  string local_80 [32];
  iterator local_60;
  size_type local_58;
  undefined1 local_50 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  hg_identify;
  string hg;
  cmCTestHG *this_local;
  string *rev;
  
  this_00 = &hg_identify.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  std::__cxx11::string::string
            ((string *)this_00,
             (string *)&(this->super_cmCTestGlobalVC).super_cmCTestVC.CommandLineTool);
  local_d7 = 1;
  local_c8 = &local_c0;
  std::__cxx11::string::string((string *)local_c8,(string *)this_00);
  local_c8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_a0,"identify",local_d5);
  local_c8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_80,"-i",&local_d6);
  local_d7 = 0;
  local_60 = &local_c0;
  local_58 = 3;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_d8);
  __l._M_len = local_58;
  __l._M_array = local_60;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_50,__l,&local_d8);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_d8);
  local_408 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_60;
  do {
    local_408 = local_408 + -1;
    std::__cxx11::string::~string((string *)local_408);
  } while (local_408 != &local_c0);
  std::allocator<char>::~allocator(&local_d6);
  std::allocator<char>::~allocator(local_d5);
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  IdentifyParser::IdentifyParser
            ((IdentifyParser *)&err.super_LineParser.Separator,this,"rev-out> ",
             __return_storage_ptr__);
  cmProcessTools::OutputLogger::OutputLogger
            ((OutputLogger *)local_398,(this->super_cmCTestGlobalVC).super_cmCTestVC.Log,"rev-err> "
            );
  std::__cxx11::string::string((string *)&local_3b8);
  cmCTestVC::RunChild((cmCTestVC *)this,
                      (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_50,(OutputParser *)&err.super_LineParser.Separator,
                      (OutputParser *)local_398,&local_3b8,Auto);
  std::__cxx11::string::~string((string *)&local_3b8);
  cmProcessTools::OutputLogger::~OutputLogger((OutputLogger *)local_398);
  IdentifyParser::~IdentifyParser((IdentifyParser *)&err.super_LineParser.Separator);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_50);
  std::__cxx11::string::~string
            ((string *)
             &hg_identify.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return __return_storage_ptr__;
}

Assistant:

std::string cmCTestHG::GetWorkingRevision()
{
  // Run plumbing "hg identify" to get work tree revision.
  std::string hg = this->CommandLineTool;
  std::vector<std::string> hg_identify = { hg, "identify", "-i" };
  std::string rev;
  IdentifyParser out(this, "rev-out> ", rev);
  OutputLogger err(this->Log, "rev-err> ");
  this->RunChild(hg_identify, &out, &err);
  return rev;
}